

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correctness.cc
# Opt level: O1

void __thiscall CorrectnessTest::regular_test(CorrectnessTest *this,uint64_t max)

{
  uint64_t uVar1;
  bool bVar2;
  uint64_t uVar3;
  char *__end;
  ulong key;
  string local_a0;
  string local_80;
  KVStore *local_60;
  string local_58;
  uint64_t local_38;
  
  local_60 = &(this->super_Test).store;
  local_38 = max;
  KVStore::get_abi_cxx11_(&local_a0,local_60,1);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,"");
  Test::expect<std::__cxx11::string>
            (&this->super_Test,&Test::not_found_abi_cxx11_,&local_a0,&local_80,0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SE","");
  KVStore::put(local_60,1,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SE","");
  KVStore::get_abi_cxx11_(&local_80,local_60,1);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,"");
  Test::expect<std::__cxx11::string>(&this->super_Test,&local_a0,&local_80,&local_58,0x12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p._0_1_ = 1;
  bVar2 = KVStore::del(local_60,1);
  local_58._M_dataplus._M_p._0_1_ = bVar2;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,"");
  Test::expect<bool>(&this->super_Test,(bool *)&local_80,(bool *)&local_58,&local_a0,0x13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  KVStore::get_abi_cxx11_(&local_a0,local_60,1);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,"");
  Test::expect<std::__cxx11::string>
            (&this->super_Test,&Test::not_found_abi_cxx11_,&local_a0,&local_80,0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffffffffff00;
  bVar2 = KVStore::del(local_60,1);
  local_58._M_dataplus._M_p._0_1_ = bVar2;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,"");
  Test::expect<bool>(&this->super_Test,(bool *)&local_80,(bool *)&local_58,&local_a0,0x15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  Test::phase(&this->super_Test);
  if (local_38 != 0) {
    uVar3 = 0;
    do {
      uVar1 = uVar3 + 1;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar1);
      KVStore::put(local_60,uVar3,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar1);
      KVStore::get_abi_cxx11_(&local_80,local_60,uVar3);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
                 ,"");
      Test::expect<std::__cxx11::string>(&this->super_Test,&local_a0,&local_80,&local_58,0x1c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar1;
    } while (local_38 != uVar1);
  }
  Test::phase(&this->super_Test);
  if (local_38 != 0) {
    uVar3 = 0;
    do {
      uVar1 = uVar3 + 1;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar1);
      KVStore::get_abi_cxx11_(&local_80,local_60,uVar3);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
                 ,"");
      Test::expect<std::__cxx11::string>(&this->super_Test,&local_a0,&local_80,&local_58,0x22);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar1;
    } while (local_38 != uVar1);
  }
  Test::phase(&this->super_Test);
  if (local_38 != 0) {
    uVar3 = 0;
    do {
      local_80._M_dataplus._M_p._0_1_ = 1;
      bVar2 = KVStore::del(local_60,uVar3);
      local_58._M_dataplus._M_p._0_1_ = bVar2;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
                 ,"");
      Test::expect<bool>(&this->super_Test,(bool *)&local_80,(bool *)&local_58,&local_a0,0x27);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 2;
    } while (uVar3 < local_38);
    key = 0;
    do {
      if ((key & 1) == 0) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,Test::not_found_abi_cxx11_._M_dataplus._M_p,
                   Test::not_found_abi_cxx11_._M_dataplus._M_p +
                   Test::not_found_abi_cxx11_._M_string_length);
      }
      else {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_a0,(char)key + '\x01');
      }
      KVStore::get_abi_cxx11_(&local_80,local_60,key);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
                 ,"");
      Test::expect<std::__cxx11::string>(&this->super_Test,&local_a0,&local_80,&local_58,0x2a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      key = key + 1;
    } while (local_38 != key);
  }
  if (1 < local_38) {
    uVar3 = 1;
    do {
      local_80._M_dataplus._M_p =
           (pointer)(CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)uVar3) & 0xffffffffffffff01);
      bVar2 = KVStore::del(local_60,uVar3);
      local_58._M_dataplus._M_p._0_1_ = bVar2;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
                 ,"");
      Test::expect<bool>(&this->super_Test,(bool *)&local_80,(bool *)&local_58,&local_a0,0x2c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
    } while (local_38 != uVar3);
  }
  Test::phase(&this->super_Test);
  Test::report(&this->super_Test);
  return;
}

Assistant:

void regular_test(uint64_t max) {
    uint64_t i;

    // Test a single key
    EXPECT(not_found, store.get(1));
    store.put(1, "SE");
    EXPECT("SE", store.get(1));
    EXPECT(true, store.del(1));
    EXPECT(not_found, store.get(1));
    EXPECT(false, store.del(1));

    phase();

    // Test multiple key-value pairs
    for (i = 0; i < max; ++i) {
      store.put(i, std::string(i + 1, 's'));
      EXPECT(std::string(i + 1, 's'), store.get(i));
    }
    phase();

    // Test after all insertions
    for (i = 0; i < max; ++i) {
      EXPECT(std::string(i + 1, 's'), store.get(i));
    }
    phase();

    // Test deletions
    for (i = 0; i < max; i += 2) EXPECT(true, store.del(i));

    for (i = 0; i < max; ++i)
      EXPECT((i & 1) ? std::string(i + 1, 's') : not_found, store.get(i));

    for (i = 1; i < max; ++i) EXPECT(i & 1, store.del(i));

    phase();

    report();
  }